

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void GC::CheckBasePointer(char *basePtr)

{
  markerType *pmVar1;
  ExternTypeInfo *type_00;
  uint local_40;
  uint size;
  char *elements;
  uint arrayPadding;
  ExternTypeInfo *type;
  uint typeId;
  markerType *marker;
  char *basePtr_local;
  
  pmVar1 = (markerType *)(basePtr + -8);
  PrintMarker(*pmVar1);
  type_00 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                      ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::commonLinker + 0x200),
                       (uint)(*pmVar1 >> 8));
  if ((*pmVar1 & 0x10) == 0) {
    if (type_00->subCat != CAT_NONE) {
      CheckVariable(basePtr,type_00);
    }
  }
  else {
    if (type_00->defaultAlign < 5) {
      local_40 = 4;
    }
    else {
      local_40 = (uint)type_00->defaultAlign;
    }
    CheckArrayElements(basePtr + local_40,*(uint *)(basePtr + local_40 + -4),type_00);
  }
  return;
}

Assistant:

void CheckBasePointer(char* basePtr)
	{
		markerType	*marker = (markerType*)(basePtr - sizeof(markerType));
		PrintMarker(*marker);

		unsigned typeId = unsigned(*marker >> 8);
		const ExternTypeInfo &type = NULLC::commonLinker->exTypes[typeId];

		if(*marker & OBJECT_ARRAY)
		{
			unsigned arrayPadding = type.defaultAlign > 4 ? type.defaultAlign : 4;

			char *elements = basePtr + arrayPadding;

			unsigned size;
			memcpy(&size, elements - sizeof(unsigned), sizeof(unsigned));

			CheckArrayElements(elements, size, type);
		}
		else
		{
			// And if type is not simple, check memory to which pointer points to
			if(type.subCat != ExternTypeInfo::CAT_NONE)
				CheckVariable(basePtr, type);
		}
	}